

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O0

Matrix6x6 * __thiscall iDynTree::ArticulatedBodyInertia::getInverse(ArticulatedBodyInertia *this)

{
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RSI;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RDI;
  Matrix6x6 *ret;
  Matrix<double,_6,_6,_0,_6,_6> abi;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_fffffffffffffdb0;
  MatrixFixSize<6U,_6U> *in_stack_fffffffffffffdb8;
  
  this_00 = in_RDI;
  MatrixFixSize<6U,_6U>::MatrixFixSize((MatrixFixSize<6U,_6U> *)in_RDI);
  Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)0x63084a);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (in_stack_fffffffffffffdb0,(Index)this_00,(Index)in_RDI);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)in_RDI,in_RSI);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (in_stack_fffffffffffffdb0,(Index)this_00,(Index)in_RDI);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)in_RDI,in_RSI);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (in_stack_fffffffffffffdb0,(Index)this_00,(Index)in_RDI);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)in_RDI,
             (DenseBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)in_RSI);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (in_stack_fffffffffffffdb0,(Index)this_00,(Index)in_RDI);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)in_RDI,in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::inverse
            ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_RSI);
  toEigen<6u,6u>(in_stack_fffffffffffffdb8);
  Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_> *)in_RSI);
  return (Matrix6x6 *)this_00;
}

Assistant:

Matrix6x6 ArticulatedBodyInertia::getInverse() const
{
    Matrix6x6 ret;

    Eigen::Matrix<double,6,6> abi;

    abi.block<3,3>(0,0) = toEigen(linearLinear);
    abi.block<3,3>(0,3) = toEigen(linearAngular);
    abi.block<3,3>(3,0) = toEigen(linearAngular).transpose();
    abi.block<3,3>(3,3) = toEigen(angularAngular);

    toEigen(ret) = abi.inverse();

    return ret;
}